

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.hpp
# Opt level: O2

void __thiscall EOPlus::State::State(State *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->has_desc = false;
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  std::_Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::_Deque_base
            (&(this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>);
  std::_Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>::_Deque_base
            (&(this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>);
  this->goal_rule = 0;
  return;
}

Assistant:

State()
			: has_desc(false)
			, goal_rule(0)
		{ }